

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_decoder.hpp
# Opt level: O2

void __thiscall
duckdb::DbpDecoder::DbpDecoder(DbpDecoder *this,data_ptr_t buffer,uint32_t buffer_len)

{
  unsigned_long uVar1;
  InvalidInputException *this_00;
  allocator local_39;
  string local_38;
  
  (this->buffer_).ptr = buffer;
  (this->buffer_).len = (ulong)buffer_len;
  uVar1 = ParquetDecodeUtils::VarintDecode<unsigned_long,true>(&this->buffer_);
  this->block_size_in_values = uVar1;
  uVar1 = ParquetDecodeUtils::VarintDecode<unsigned_long,true>(&this->buffer_);
  this->number_of_miniblocks_per_block = uVar1;
  this->number_of_values_in_a_miniblock = this->block_size_in_values / uVar1;
  uVar1 = ParquetDecodeUtils::VarintDecode<unsigned_long,true>(&this->buffer_);
  this->total_value_count = uVar1;
  uVar1 = ParquetDecodeUtils::VarintDecode<unsigned_long,true>(&this->buffer_);
  this->previous_value = -(ulong)((uint)uVar1 & 1) ^ uVar1 >> 1;
  this->is_first_value = true;
  this->read_values = 0;
  this->min_delta = 0x7fffffffffffffff;
  this->miniblock_index = this->number_of_miniblocks_per_block - 1;
  this->list_of_bitwidths_of_miniblocks = (bitpacking_width_t *)0x0;
  this->miniblock_offset = this->number_of_values_in_a_miniblock;
  this->unpacked_data_offset = 0x20;
  if ((this->number_of_values_in_a_miniblock & 0x1f) == 0 &&
      this->block_size_in_values % this->number_of_miniblocks_per_block == 0) {
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Parquet file has invalid block sizes for DELTA_BINARY_PACKED",
             &local_39);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DbpDecoder(const data_ptr_t buffer, const uint32_t buffer_len)
	    : buffer_(buffer, buffer_len),
	      //<block size in values> <number of miniblocks in a block> <total value count> <first value>
	      block_size_in_values(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_)),
	      number_of_miniblocks_per_block(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_)),
	      number_of_values_in_a_miniblock(block_size_in_values / number_of_miniblocks_per_block),
	      total_value_count(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_)),
	      previous_value(ParquetDecodeUtils::ZigzagToInt(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_))),
	      // init state to something sane
	      is_first_value(true), read_values(0), min_delta(NumericLimits<int64_t>::Maximum()),
	      miniblock_index(number_of_miniblocks_per_block - 1), list_of_bitwidths_of_miniblocks(nullptr),
	      miniblock_offset(number_of_values_in_a_miniblock),
	      unpacked_data_offset(BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
		if (!(block_size_in_values % number_of_miniblocks_per_block == 0 &&
		      number_of_values_in_a_miniblock % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0)) {
			throw InvalidInputException("Parquet file has invalid block sizes for DELTA_BINARY_PACKED");
		}
	}